

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O1

void __thiscall indigox::Atom::SetElement(Atom *this,Int e)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PeriodicTable_p PT;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  uint8_t local_28;
  _Base_ptr local_20;
  
  PeriodicTable::GetInstance();
  PeriodicTable::GetElement((PeriodicTable *)&local_38,local_28);
  p_Var2 = p_Stack_30;
  peVar1 = local_38;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  if (local_20 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  return;
}

Assistant:

void Atom::SetElement(Int e) {
    PeriodicTable_p PT = PeriodicTable::GetInstance();
    element_ = PT->GetElement((uint8_t)e);
  }